

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O0

Expression * __thiscall wasm::AlignmentLowering::lowerStoreI32(AlignmentLowering *this,Store *curr)

{
  Index IVar1;
  bool bVar2;
  address64_t aVar3;
  Module *pMVar4;
  Memory *pMVar5;
  Function *pFVar6;
  ExpressionList *pEVar7;
  LocalGet *pLVar8;
  LocalGet *pLVar9;
  Store *pSVar10;
  Const *pCVar11;
  Binary *pBVar12;
  Type local_208;
  Type local_200;
  uintptr_t local_1f8;
  Address local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  Type local_1d8;
  Type local_1d0;
  uintptr_t local_1c8;
  Address local_1c0;
  pointer local_1b8;
  pointer local_1b0;
  Type local_1a8;
  Type local_1a0;
  uintptr_t local_198;
  Address local_190;
  pointer local_188;
  pointer local_180;
  Type local_178;
  Type local_170;
  uintptr_t local_168;
  Address local_160;
  pointer local_158;
  pointer local_150;
  Type local_148;
  Type local_140;
  uintptr_t local_138;
  Address local_130;
  pointer local_128;
  pointer local_120;
  Type local_118;
  Type local_110;
  uintptr_t local_108;
  Address local_100;
  pointer local_f8;
  pointer local_f0;
  Type local_e8;
  Type local_e0;
  uintptr_t local_d8;
  Address local_d0;
  pointer local_c8;
  pointer local_c0;
  Type local_b8;
  Type local_b0;
  uintptr_t local_a8;
  Address local_a0;
  LocalSet *local_98;
  LocalSet *local_90;
  initializer_list<wasm::Expression_*> local_88;
  Block *local_78;
  Block *block;
  Index local_64;
  uintptr_t uStack_60;
  Index tempValue;
  Index local_54;
  Type TStack_50;
  Index tempPtr;
  Type indexType;
  Memory *mem;
  Builder local_28;
  Builder builder;
  Store *curr_local;
  AlignmentLowering *this_local;
  
  builder.wasm = (Module *)curr;
  aVar3 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
  if ((aVar3 == 0) ||
     (aVar3 = wasm::Address::operator_cast_to_unsigned_long
                        ((Address *)
                         &((builder.wasm)->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish),
     aVar3 == *(byte *)&((builder.wasm)->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
    this_local = (AlignmentLowering *)builder.wasm;
  }
  else {
    pMVar4 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                        ).
                        super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        .
                        super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                      );
    Builder::Builder(&local_28,pMVar4);
    mem._4_4_ = 2;
    bVar2 = wasm::Type::operator==
                      ((Type *)(((builder.wasm)->globals).
                                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1),
                       (BasicType *)((long)&mem + 4));
    if (!bVar2) {
      __assert_fail("curr->value->type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                    ,0x92,"Expression *wasm::AlignmentLowering::lowerStoreI32(Store *)");
    }
    pMVar4 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                        ).
                        super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        .
                        super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                      );
    indexType.id = (uintptr_t)
                   ((builder.wasm)->tags).
                   super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pMVar5 = Module::getMemory(pMVar4,(IString)*(IString *)
                                                &((builder.wasm)->tags).
                                                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                 ._M_impl.super__Vector_impl_data);
    TStack_50.id = (pMVar5->indexType).id;
    pFVar6 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        );
    uStack_60 = TStack_50.id;
    local_54 = Builder::addVar(pFVar6,TStack_50);
    pFVar6 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        );
    wasm::Type::Type((Type *)&block,i32);
    local_64 = Builder::addVar(pFVar6,(Type)block);
    local_98 = Builder::makeLocalSet
                         (&local_28,local_54,
                          (Expression *)
                          ((builder.wasm)->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    local_90 = Builder::makeLocalSet
                         (&local_28,local_64,
                          (Expression *)
                          ((builder.wasm)->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
    local_88._M_array = (iterator)&local_98;
    local_88._M_len = 2;
    local_78 = Builder::makeBlock(&local_28,&local_88);
    if (*(char *)&((builder.wasm)->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x02') {
      pEVar7 = &local_78->list;
      local_a0.addr =
           (address64_t)
           ((builder.wasm)->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_a8 = TStack_50.id;
      pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
      IVar1 = local_64;
      wasm::Type::Type(&local_b0,i32);
      pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_b0);
      wasm::Type::Type(&local_b8,i32);
      local_c8 = ((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_c0 = ((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pSVar10 = Builder::makeStore(&local_28,1,local_a0,1,(Expression *)pLVar8,(Expression *)pLVar9,
                                   local_b8,(IString)*(IString *)
                                                      &((builder.wasm)->tags).
                                                                                                              
                                                  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                  ._M_impl.super__Vector_impl_data);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar7->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,(Expression *)pSVar10);
      pEVar7 = &local_78->list;
      aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions);
      wasm::Address::Address(&local_d0,aVar3 + 1);
      local_d8 = TStack_50.id;
      pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
      IVar1 = local_64;
      wasm::Type::Type(&local_e0,i32);
      pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_e0);
      pCVar11 = Builder::makeConst<int>(&local_28,8);
      pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
      wasm::Type::Type(&local_e8,i32);
      local_f8 = ((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_f0 = ((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pSVar10 = Builder::makeStore(&local_28,1,local_d0,1,(Expression *)pLVar8,(Expression *)pBVar12
                                   ,local_e8,
                                   (IString)*(IString *)
                                             &((builder.wasm)->tags).
                                              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                              ._M_impl.super__Vector_impl_data);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar7->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,(Expression *)pSVar10);
    }
    else {
      if (*(char *)&((builder.wasm)->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != '\x04') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0xec);
      }
      aVar3 = wasm::Address::operator_cast_to_unsigned_long
                        ((Address *)
                         &((builder.wasm)->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      if (aVar3 == 1) {
        pEVar7 = &local_78->list;
        local_100.addr =
             (address64_t)
             ((builder.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_108 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_110,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_110);
        wasm::Type::Type(&local_118,i32);
        local_128 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_120 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,1,local_100,1,(Expression *)pLVar8,
                                     (Expression *)pLVar9,local_118,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
        pEVar7 = &local_78->list;
        aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions)
        ;
        wasm::Address::Address(&local_130,aVar3 + 1);
        local_138 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_140,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_140);
        pCVar11 = Builder::makeConst<int>(&local_28,8);
        pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11
                                     );
        wasm::Type::Type(&local_148,i32);
        local_158 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_150 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,1,local_130,1,(Expression *)pLVar8,
                                     (Expression *)pBVar12,local_148,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
        pEVar7 = &local_78->list;
        aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions)
        ;
        wasm::Address::Address(&local_160,aVar3 + 2);
        local_168 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_170,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_170);
        pCVar11 = Builder::makeConst<int>(&local_28,0x10);
        pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11
                                     );
        wasm::Type::Type(&local_178,i32);
        local_188 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_180 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,1,local_160,1,(Expression *)pLVar8,
                                     (Expression *)pBVar12,local_178,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
        pEVar7 = &local_78->list;
        aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions)
        ;
        wasm::Address::Address(&local_190,aVar3 + 3);
        local_198 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_1a0,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_1a0);
        pCVar11 = Builder::makeConst<int>(&local_28,0x18);
        pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11
                                     );
        wasm::Type::Type(&local_1a8,i32);
        local_1b8 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_1b0 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,1,local_190,1,(Expression *)pLVar8,
                                     (Expression *)pBVar12,local_1a8,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
      }
      else {
        aVar3 = wasm::Address::operator_cast_to_unsigned_long
                          ((Address *)
                           &((builder.wasm)->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        if (aVar3 != 2) {
          handle_unreachable("invalid alignment",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                             ,0xe9);
        }
        pEVar7 = &local_78->list;
        local_1c0.addr =
             (address64_t)
             ((builder.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1c8 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_1d0,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_1d0);
        wasm::Type::Type(&local_1d8,i32);
        local_1e8 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_1e0 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,2,local_1c0,2,(Expression *)pLVar8,
                                     (Expression *)pLVar9,local_1d8,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
        pEVar7 = &local_78->list;
        aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions)
        ;
        wasm::Address::Address(&local_1f0,aVar3 + 2);
        local_1f8 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_200,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_200);
        pCVar11 = Builder::makeConst<int>(&local_28,0x10);
        pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11
                                     );
        wasm::Type::Type(&local_208,i32);
        pSVar10 = Builder::makeStore(&local_28,2,local_1f0,2,(Expression *)pLVar8,
                                     (Expression *)pBVar12,local_208,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
      }
    }
    Block::finalize(local_78);
    this_local = (AlignmentLowering *)local_78;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* lowerStoreI32(Store* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    Builder builder(*getModule());
    assert(curr->value->type == Type::i32);
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    auto tempPtr = builder.addVar(getFunction(), indexType);
    auto tempValue = builder.addVar(getFunction(), Type::i32);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(tempPtr, curr->ptr),
                         builder.makeLocalSet(tempValue, curr->value)});
    if (curr->bytes == 2) {
      block->list.push_back(
        builder.makeStore(1,
                          curr->offset,
                          1,
                          builder.makeLocalGet(tempPtr, indexType),
                          builder.makeLocalGet(tempValue, Type::i32),
                          Type::i32,
                          curr->memory));
      block->list.push_back(builder.makeStore(
        1,
        curr->offset + 1,
        1,
        builder.makeLocalGet(tempPtr, indexType),
        builder.makeBinary(ShrUInt32,
                           builder.makeLocalGet(tempValue, Type::i32),
                           builder.makeConst(int32_t(8))),
        Type::i32,
        curr->memory));
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        block->list.push_back(
          builder.makeStore(1,
                            curr->offset,
                            1,
                            builder.makeLocalGet(tempPtr, indexType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 1,
          1,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(8))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 2,
          1,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 3,
          1,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(24))),
          Type::i32,
          curr->memory));
      } else if (curr->align == 2) {
        block->list.push_back(
          builder.makeStore(2,
                            curr->offset,
                            2,
                            builder.makeLocalGet(tempPtr, indexType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          2,
          curr->offset + 2,
          2,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    block->finalize();
    return block;
  }